

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_schnorrsig_sign_internal
              (secp256k1_context *ctx,uchar *sig64,uchar *msg,size_t msglen,
              secp256k1_keypair *keypair,secp256k1_nonce_function_hardened noncefp,void *ndata)

{
  uint *puVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  secp256k1_scalar sVar6;
  char cVar7;
  int i;
  uint uVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  uchar *msg_00;
  code *pcVar12;
  secp256k1_gej *r_00;
  secp256k1_context *ctx_00;
  secp256k1_keypair *r_01;
  uchar *p;
  undefined1 auVar13 [16];
  secp256k1_scalar sk;
  secp256k1_scalar local_254;
  unsigned_long _zzq_result_1;
  uint local_244;
  size_t local_240;
  uchar *local_238;
  secp256k1_scalar e;
  int vflag;
  undefined4 uStack_224;
  uchar *local_220;
  uint64_t local_218;
  uint64_t local_210;
  uint64_t local_208;
  undefined8 local_200;
  uchar seckey [32];
  uchar buf [32];
  uchar pk_buf [32];
  secp256k1_ge r;
  secp256k1_ge pk;
  secp256k1_gej rj;
  
  r_00 = (secp256k1_gej *)&sk;
  buf[0x10] = '\0';
  buf[0x11] = '\0';
  buf[0x12] = '\0';
  buf[0x13] = '\0';
  buf[0x14] = '\0';
  buf[0x15] = '\0';
  buf[0x16] = '\0';
  buf[0x17] = '\0';
  buf[0x18] = '\0';
  buf[0x19] = '\0';
  buf[0x1a] = '\0';
  buf[0x1b] = '\0';
  buf[0x1c] = '\0';
  buf[0x1d] = '\0';
  buf[0x1e] = '\0';
  buf[0x1f] = '\0';
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  buf[8] = '\0';
  buf[9] = '\0';
  buf[10] = '\0';
  buf[0xb] = '\0';
  buf[0xc] = '\0';
  buf[0xd] = '\0';
  buf[0xe] = '\0';
  buf[0xf] = '\0';
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_schnorrsig_sign_internal_cold_8();
LAB_0010f09b:
    secp256k1_schnorrsig_sign_internal_cold_7();
    return 0;
  }
  if ((ctx->ecmult_gen_ctx).built == 0) goto LAB_0010f09b;
  if (sig64 == (uchar *)0x0) {
    secp256k1_schnorrsig_sign_internal_cold_6();
    return 0;
  }
  if (msglen != 0 && msg == (uchar *)0x0) {
    secp256k1_schnorrsig_sign_internal_cold_5();
    return 0;
  }
  if (keypair == (secp256k1_keypair *)0x0) {
    secp256k1_schnorrsig_sign_internal_cold_4();
    return 0;
  }
  pcVar12 = nonce_function_bip340;
  if (noncefp != (secp256k1_nonce_function_hardened)0x0) {
    pcVar12 = noncefp;
  }
  r_01 = keypair;
  local_238 = msg;
  uVar8 = secp256k1_keypair_load(ctx,&sk,&pk,keypair);
  secp256k1_fe_verify(&pk.y);
  if (pk.y.normalized == 0) {
    secp256k1_schnorrsig_sign_internal_cold_3();
  }
  else {
    local_244 = uVar8;
    local_240 = msglen;
    if (((byte)pk.y.n[0] & 1) != 0) {
      secp256k1_scalar_verify((secp256k1_scalar *)(ulong)sk);
      uVar8 = 0xd - sk;
      if (sk == 0) {
        uVar8 = 0;
      }
      sk = uVar8;
      secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar8);
    }
    secp256k1_scalar_verify((secp256k1_scalar *)(ulong)sk);
    seckey[0] = '\0';
    seckey[1] = '\0';
    seckey[2] = '\0';
    seckey[3] = '\0';
    seckey[4] = '\0';
    seckey[5] = '\0';
    seckey[6] = '\0';
    seckey[7] = '\0';
    seckey[8] = '\0';
    seckey[9] = '\0';
    seckey[10] = '\0';
    seckey[0xb] = '\0';
    seckey[0xc] = '\0';
    seckey[0xd] = '\0';
    seckey[0xe] = '\0';
    seckey[0xf] = '\0';
    uVar8 = sk >> 0x18 | (sk & 0xff0000) >> 8 | (sk & 0xff00) << 8 | sk << 0x18;
    seckey._16_12_ = SUB1612((undefined1  [16])0x0,0);
    seckey[0x1c] = (char)uVar8;
    seckey[0x1d] = (char)(uVar8 >> 8);
    seckey[0x1e] = (char)(uVar8 >> 0x10);
    seckey[0x1f] = (char)(uVar8 >> 0x18);
    r_01 = (secp256k1_keypair *)pk_buf;
    secp256k1_fe_get_b32((uchar *)r_01,&pk.x);
    iVar9 = (*pcVar12)(buf,local_238,local_240,seckey,(uchar *)r_01,"BIP0340/nonce",0xd,ndata);
    lVar10 = 0;
    uVar8 = 0;
    do {
      uVar11 = (uint)buf[lVar10] | uVar8 << 8;
      uVar8 = uVar11 - (uVar11 / 0xd + (uVar11 / 0xd) * 0xc);
      if (uVar11 < 0xd) {
        uVar8 = uVar11;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x20);
    local_254 = uVar8;
    secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar8);
    secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar8);
    if (iVar9 == 0) {
      local_244 = 0;
    }
    if (uVar8 == 0) {
      local_244 = 0;
    }
    uVar8 = local_244 ^ 1;
    pcVar12 = (code *)(ulong)uVar8;
    _vflag = CONCAT44(uStack_224,local_244) ^ 1;
    rj.x.n[0] = 0x4d430005;
    rj.x.n[2] = 4;
    keypair = (secp256k1_keypair *)0x0;
    rj.x.n[3] = 0;
    rj.x.n[4] = 0;
    rj.x.magnitude = 0;
    rj.x.normalized = 0;
    r.x.n[0] = 0;
    local_254 = uVar8 & 1 | uVar8 - 1 & local_254;
    rj.x.n[1] = (uint64_t)&local_254;
    secp256k1_scalar_verify((secp256k1_scalar *)(ulong)local_254);
    r_00 = &rj;
    secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx,r_00,&local_254);
    secp256k1_ge_set_gej(&r,r_00);
    if (ctx->declassify == 0) goto LAB_0010ee15;
  }
  uVar8 = (uint)pcVar12;
  secp256k1_schnorrsig_sign_internal_cold_1();
LAB_0010ee15:
  ctx_00 = (secp256k1_context *)&r.y;
  secp256k1_fe_normalize_var((secp256k1_fe *)ctx_00);
  secp256k1_fe_verify((secp256k1_fe *)ctx_00);
  if (r.y.normalized == 0) {
    secp256k1_schnorrsig_sign_internal_cold_2();
    iVar9 = secp256k1_schnorrsig_sign_internal
                      (ctx_00,(uchar *)r_00,msg_00,0x20,keypair,nonce_function_bip340,r_01);
    return iVar9;
  }
  if (((byte)r.y.n[0] & 1) != 0) {
    secp256k1_scalar_verify((secp256k1_scalar *)(ulong)local_254);
    uVar11 = 0xd - local_254;
    if (local_254 == 0) {
      uVar11 = 0;
    }
    local_254 = uVar11;
    secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar11);
  }
  secp256k1_fe_normalize_var(&r.x);
  secp256k1_fe_get_b32(sig64,&r.x);
  secp256k1_schnorrsig_challenge(&e,sig64,local_238,local_240,pk_buf);
  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)e);
  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)sk);
  uVar11 = e * sk;
  e = uVar11 - (uVar11 / 0xd + (uVar11 / 0xd) * 0xc);
  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)e);
  secp256k1_scalar_add(&e,&e,&local_254);
  sVar6 = e;
  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)e);
  uVar11 = local_244;
  *(undefined1 (*) [16])(sig64 + 0x2c) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(sig64 + 0x20) = (undefined1  [16])0x0;
  *(secp256k1_scalar *)(sig64 + 0x3c) =
       sVar6 >> 0x18 | (sVar6 & 0xff0000) >> 8 | (sVar6 & 0xff00) << 8 | sVar6 << 0x18;
  cVar7 = (char)uVar8 + -1;
  auVar13 = ZEXT216(CONCAT11(cVar7,cVar7));
  auVar13 = pshuflw(auVar13,auVar13,0);
  uVar8 = auVar13._0_4_;
  lVar10 = 0;
  do {
    puVar1 = (uint *)(sig64 + lVar10);
    uVar3 = puVar1[1];
    uVar4 = puVar1[2];
    uVar5 = puVar1[3];
    puVar2 = (uint *)(sig64 + lVar10);
    *puVar2 = *puVar1 & uVar8;
    puVar2[1] = uVar3 & uVar8;
    puVar2[2] = uVar4 & uVar8;
    puVar2[3] = uVar5 & uVar8;
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x40);
  local_254 = 0;
  sk = 0;
  seckey[0] = '\0';
  seckey[1] = '\0';
  seckey[2] = '\0';
  seckey[3] = '\0';
  seckey[4] = '\0';
  seckey[5] = '\0';
  seckey[6] = '\0';
  seckey[7] = '\0';
  seckey[8] = '\0';
  seckey[9] = '\0';
  seckey[10] = '\0';
  seckey[0xb] = '\0';
  seckey[0xc] = '\0';
  seckey[0xd] = '\0';
  seckey[0xe] = '\0';
  seckey[0xf] = '\0';
  seckey[0x10] = '\0';
  seckey[0x11] = '\0';
  seckey[0x12] = '\0';
  seckey[0x13] = '\0';
  seckey[0x14] = '\0';
  seckey[0x15] = '\0';
  seckey[0x16] = '\0';
  seckey[0x17] = '\0';
  seckey[0x18] = '\0';
  seckey[0x19] = '\0';
  seckey[0x1a] = '\0';
  seckey[0x1b] = '\0';
  seckey[0x1c] = '\0';
  seckey[0x1d] = '\0';
  seckey[0x1e] = '\0';
  seckey[0x1f] = '\0';
  local_220 = seckey;
  _vflag = 0x4d430001;
  local_218 = 0x20;
  local_210 = 0;
  local_208 = 0;
  local_200._0_4_ = 0;
  local_200._4_4_ = 0;
  _zzq_result_1 = 0;
  memset(&rj,0,0x98);
  return uVar11;
}

Assistant:

static int secp256k1_schnorrsig_sign_internal(const secp256k1_context* ctx, unsigned char *sig64, const unsigned char *msg, size_t msglen, const secp256k1_keypair *keypair, secp256k1_nonce_function_hardened noncefp, void *ndata) {
    secp256k1_scalar sk;
    secp256k1_scalar e;
    secp256k1_scalar k;
    secp256k1_gej rj;
    secp256k1_ge pk;
    secp256k1_ge r;
    unsigned char buf[32] = { 0 };
    unsigned char pk_buf[32];
    unsigned char seckey[32];
    int ret = 1;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(sig64 != NULL);
    ARG_CHECK(msg != NULL || msglen == 0);
    ARG_CHECK(keypair != NULL);

    if (noncefp == NULL) {
        noncefp = secp256k1_nonce_function_bip340;
    }

    ret &= secp256k1_keypair_load(ctx, &sk, &pk, keypair);
    /* Because we are signing for a x-only pubkey, the secret key is negated
     * before signing if the point corresponding to the secret key does not
     * have an even Y. */
    if (secp256k1_fe_is_odd(&pk.y)) {
        secp256k1_scalar_negate(&sk, &sk);
    }

    secp256k1_scalar_get_b32(seckey, &sk);
    secp256k1_fe_get_b32(pk_buf, &pk.x);
    ret &= !!noncefp(buf, msg, msglen, seckey, pk_buf, bip340_algo, sizeof(bip340_algo), ndata);
    secp256k1_scalar_set_b32(&k, buf, NULL);
    ret &= !secp256k1_scalar_is_zero(&k);
    secp256k1_scalar_cmov(&k, &secp256k1_scalar_one, !ret);

    secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &rj, &k);
    secp256k1_ge_set_gej(&r, &rj);

    /* We declassify r to allow using it as a branch point. This is fine
     * because r is not a secret. */
    secp256k1_declassify(ctx, &r, sizeof(r));
    secp256k1_fe_normalize_var(&r.y);
    if (secp256k1_fe_is_odd(&r.y)) {
        secp256k1_scalar_negate(&k, &k);
    }
    secp256k1_fe_normalize_var(&r.x);
    secp256k1_fe_get_b32(&sig64[0], &r.x);

    secp256k1_schnorrsig_challenge(&e, &sig64[0], msg, msglen, pk_buf);
    secp256k1_scalar_mul(&e, &e, &sk);
    secp256k1_scalar_add(&e, &e, &k);
    secp256k1_scalar_get_b32(&sig64[32], &e);

    secp256k1_memczero(sig64, 64, !ret);
    secp256k1_scalar_clear(&k);
    secp256k1_scalar_clear(&sk);
    secp256k1_memclear(seckey, sizeof(seckey));
    secp256k1_gej_clear(&rj);

    return ret;
}